

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O3

void Dar_LibCreateData(Dar_Lib_t *p,int nDatas)

{
  Dar_LibDat_t *pDVar1;
  
  if (p->nDatas != nDatas) {
    if (p->pDatas != (Dar_LibDat_t *)0x0) {
      free(p->pDatas);
    }
    p->nDatas = nDatas;
    pDVar1 = (Dar_LibDat_t *)calloc(1,(long)nDatas * 0x18);
    p->pDatas = pDVar1;
  }
  return;
}

Assistant:

void Dar_LibCreateData( Dar_Lib_t * p, int nDatas )
{
    if ( p->nDatas == nDatas )
        return;
    ABC_FREE( p->pDatas );
    // allocate datas
    p->nDatas = nDatas;
    p->pDatas = ABC_ALLOC( Dar_LibDat_t, nDatas );
    memset( p->pDatas, 0, sizeof(Dar_LibDat_t) * nDatas );
}